

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heap.h
# Opt level: O0

void __thiscall Heap<SAT::VarOrderLt>::percolateUp(Heap<SAT::VarOrderLt> *this,int i)

{
  uint index;
  uint uVar1;
  uint *puVar2;
  int *piVar3;
  uint in_ESI;
  long in_RDI;
  int x;
  vec<int> *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  int in_stack_ffffffffffffffc4;
  undefined1 local_19;
  undefined4 local_c;
  
  puVar2 = (uint *)vec<int>::operator[]((vec<int> *)(in_RDI + 8),in_ESI);
  index = *puVar2;
  local_c = in_ESI;
  while( true ) {
    local_19 = false;
    if (local_c != 0) {
      uVar1 = parent(local_c);
      vec<int>::operator[]((vec<int> *)(in_RDI + 8),uVar1);
      local_19 = SAT::VarOrderLt::operator()
                           ((VarOrderLt *)
                            CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                            (int)((ulong)in_stack_ffffffffffffffb8 >> 0x20),
                            (int)in_stack_ffffffffffffffb8);
    }
    if (local_19 == false) break;
    in_stack_ffffffffffffffb8 = (vec<int> *)(in_RDI + 8);
    uVar1 = parent(local_c);
    piVar3 = vec<int>::operator[](in_stack_ffffffffffffffb8,uVar1);
    in_stack_ffffffffffffffc4 = *piVar3;
    piVar3 = vec<int>::operator[]((vec<int> *)(in_RDI + 8),local_c);
    *piVar3 = in_stack_ffffffffffffffc4;
    puVar2 = (uint *)vec<int>::operator[]((vec<int> *)(in_RDI + 8),local_c);
    puVar2 = (uint *)vec<int>::operator[]((vec<int> *)(in_RDI + 0x18),*puVar2);
    *puVar2 = local_c;
    local_c = parent(local_c);
  }
  puVar2 = (uint *)vec<int>::operator[]((vec<int> *)(in_RDI + 8),local_c);
  *puVar2 = index;
  puVar2 = (uint *)vec<int>::operator[]((vec<int> *)(in_RDI + 0x18),index);
  *puVar2 = local_c;
  return;
}

Assistant:

inline void percolateUp(int i) {
		const int x = heap[i];
		while (i != 0 && lt(x, heap[parent(i)])) {
			heap[i] = heap[parent(i)];
			indices[heap[i]] = i;
			i = parent(i);
		}
		heap[i] = x;
		indices[x] = i;
	}